

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O0

int cache_get6(uint64_t a,uint64_t b,uint64_t c,uint64_t d,uint64_t e,uint64_t f,uint64_t *res1,
              uint64_t *res2)

{
  ulong *puVar1;
  ulong uVar2;
  uint64_t uVar3;
  cache_entry_t pcVar4;
  ulong uVar5;
  uint64_t x;
  uint64_t s;
  cache6_entry_t bucket;
  uint64_t *s_bucket;
  uint64_t hash;
  uint64_t f_local;
  uint64_t e_local;
  uint64_t d_local;
  uint64_t c_local;
  uint64_t b_local;
  uint64_t a_local;
  
  uVar3 = cache_hash6(a,b,c,d,e,f);
  puVar1 = (ulong *)(cache_status + (uVar3 & cache_mask & 0xfffffffffffffffe));
  pcVar4 = cache_table + (uVar3 & cache_mask & 0xfffffffffffffffe);
  uVar2 = *puVar1;
  uVar5 = uVar3 >> 0x20 & 0x7fff0000 | 0x4000000;
  if ((uVar2 & 0xffff0000ffff0000) == (uVar5 | uVar5 << 0x20)) {
    if (((pcVar4->a == a) && (pcVar4->b == b)) && (pcVar4->c == c)) {
      if (((pcVar4[1].a == d) && (pcVar4[1].b == e)) && (pcVar4[1].c == f)) {
        *res1 = pcVar4->res;
        if (res2 != (uint64_t *)0x0) {
          *res2 = pcVar4[1].res;
        }
        a_local._4_4_ = (uint)(*puVar1 == uVar2);
      }
      else {
        a_local._4_4_ = 0;
      }
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int
cache_get6(uint64_t a, uint64_t b, uint64_t c, uint64_t d, uint64_t e, uint64_t f, uint64_t *res1, uint64_t *res2)
{
    const uint64_t hash = cache_hash6(a, b, c, d, e, f);
#if CACHE_MASK
    _Atomic(uint64_t) *s_bucket = (_Atomic(uint64_t)*)cache_status + (hash & cache_mask)/2;
    cache6_entry_t bucket = (cache6_entry_t)cache_table + (hash & cache_mask)/2;
#else
    _Atomic(uint64_t) *s_bucket = (_Atomic(uint64_t)*)cache_status + (hash % cache_size)/2;
    cache6_entry_t bucket = (cache6_entry_t)cache_table + (hash % cache_size)/2;
#endif
    // can be relaxed, we check again afterwards
    const uint64_t s = atomic_load_explicit(s_bucket, memory_order_relaxed);
    // abort if locked or second part of 2-part entry or if different hash
    uint64_t x = ((hash>>32) & 0x7fff0000) | 0x04000000;
    x = x | (x<<32);
    if ((s & 0xffff0000ffff0000) != x) return 0;
    // abort if key different
    if (bucket->a != a || bucket->b != b || bucket->c != c) return 0;
    if (bucket->d != d || bucket->e != e || bucket->f != f) return 0;
    *res1 = bucket->res;
    if (res2) *res2 = bucket->res2;
    // abort if status field changed after compiler_barrier()
    return atomic_load_explicit(s_bucket, memory_order_acquire) == s ? 1 : 0;
}